

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayBase.cpp
# Opt level: O0

TileArray * __thiscall amrex::FabArrayBase::getTileArray(FabArrayBase *this,IntVect *tilesize)

{
  CacheStats *this_00;
  mapped_type *pmVar1;
  IntVect *in_RSI;
  FabArrayBase *in_RDI;
  IntVect IVar2;
  IntVect *crse_ratio;
  TileArray *p;
  TileArray *in_stack_00000140;
  IntVect *in_stack_00000148;
  FabArrayBase *in_stack_00000150;
  BoxArray *in_stack_ffffffffffffffb0;
  _Rb_tree_color local_38;
  int local_2c;
  int iVar3;
  map<amrex::FabArrayBase::BDKey,_std::map<std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray,_std::less<std::pair<amrex::IntVect,_amrex::IntVect>_>,_std::allocator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>_>,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_std::map<std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray,_std::less<std::pair<amrex::IntVect,_amrex::IntVect>_>,_std::allocator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>_>_>_>_>
  *this_01;
  
  boxArray(in_RDI);
  IVar2 = BoxArray::crseRatio(in_stack_ffffffffffffffb0);
  local_2c = IVar2.vect[0];
  iVar3 = IVar2.vect[1];
  local_38 = IVar2.vect[2];
  this_01 = (map<amrex::FabArrayBase::BDKey,_std::map<std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray,_std::less<std::pair<amrex::IntVect,_amrex::IntVect>_>,_std::allocator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>_>,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_std::map<std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray,_std::less<std::pair<amrex::IntVect,_amrex::IntVect>_>,_std::allocator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>_>_>_>_>
             *)&stack0xffffffffffffffd4;
  this_00 = (CacheStats *)
            std::
            map<amrex::FabArrayBase::BDKey,_std::map<std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray,_std::less<std::pair<amrex::IntVect,_amrex::IntVect>_>,_std::allocator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>_>,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_std::map<std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray,_std::less<std::pair<amrex::IntVect,_amrex::IntVect>_>,_std::allocator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>_>_>_>_>
            ::operator[](this_01,IVar2.vect._4_8_);
  std::pair<amrex::IntVect,_amrex::IntVect>::pair<amrex::IntVect,_amrex::IntVect,_true>
            ((pair<amrex::IntVect,_amrex::IntVect> *)&stack0xffffffffffffffa8,in_RSI,
             (IntVect *)this_01);
  pmVar1 = std::
           map<std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray,_std::less<std::pair<amrex::IntVect,_amrex::IntVect>_>,_std::allocator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>_>
           ::operator[]((map<std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray,_std::less<std::pair<amrex::IntVect,_amrex::IntVect>_>,_std::allocator<std::pair<const_std::pair<amrex::IntVect,_amrex::IntVect>,_amrex::FabArrayBase::TileArray>_>_>
                         *)this_01,(key_type *)CONCAT44(local_38,iVar3));
  if (pmVar1->nuse == -1) {
    buildTileArray(in_stack_00000150,in_stack_00000148,in_stack_00000140);
    pmVar1->nuse = 0;
    CacheStats::recordBuild(this_00);
  }
  pmVar1->nuse = pmVar1->nuse + 1;
  CacheStats::recordUse((CacheStats *)m_TAC_stats);
  return pmVar1;
}

Assistant:

const FabArrayBase::TileArray*
FabArrayBase::getTileArray (const IntVect& tilesize) const
{
    TileArray* p;

#ifdef AMREX_USE_OMP
#pragma omp critical(gettilearray)
#endif
    {
        BL_ASSERT(getBDKey() == m_bdkey);

        const IntVect& crse_ratio = boxArray().crseRatio();
        p = &FabArrayBase::m_TheTileArrayCache[m_bdkey][std::pair<IntVect,IntVect>(tilesize,crse_ratio)];
        if (p->nuse == -1) {
            buildTileArray(tilesize, *p);
            p->nuse = 0;
            m_TAC_stats.recordBuild();
#ifdef AMREX_MEM_PROFILING
            m_TAC_stats.bytes += p->bytes();
            m_TAC_stats.bytes_hwm = std::max(m_TAC_stats.bytes_hwm,
                                             m_TAC_stats.bytes);
#endif
        }
#ifdef AMREX_USE_OMP
#pragma omp master
#endif
        {
            ++(p->nuse);
            m_TAC_stats.recordUse();
        }
    }

    return p;
}